

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fields.c
# Opt level: O1

void destroy2Dfield(void **field,int sizeX)

{
  ulong uVar1;
  
  if (field != (void **)0x0) {
    if (0 < sizeX) {
      uVar1 = 0;
      do {
        if (field[uVar1] != (void *)0x0) {
          free(field[uVar1]);
        }
        uVar1 = uVar1 + 1;
      } while ((uint)sizeX != uVar1);
    }
    free(field);
    return;
  }
  return;
}

Assistant:

void destroy2Dfield (void** field, int sizeX)
{
	if (field == NULL)
		return;
	for (int i = 0; i < sizeX; i++)
	{
		destroy1Dfield((void*)field[i]);
	}
	free(field);
	return;
}